

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::Token> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,MetaVariable *this)

{
  Token *value;
  Token *v;
  MetaVariable *this_local;
  
  value = tinyusdz::value::Value::as<tinyusdz::Token>(&this->_value,false);
  if (value == (Token *)0x0) {
    nonstd::optional_lite::optional<tinyusdz::Token>::optional(__return_storage_ptr__);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<const_tinyusdz::Token_&,_0>
              (__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }